

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O3

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings
          (VerifierTemplate<false> *this,
          Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  bVar1 = true;
  if ((vec != (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0) &&
     (*(int *)vec != 0)) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      bVar1 = VerifyString(this,(String *)
                                (vec + (ulong)*(uint *)(vec + (ulong)uVar2 + 4) + (ulong)uVar2 + 4))
      ;
      if (!bVar1) {
        return bVar1;
      }
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + 4;
    } while (uVar3 < *(uint *)vec);
  }
  return bVar1;
}

Assistant:

bool VerifyVectorOfStrings(const Vector<Offset<String>> *const vec) const {
    if (vec) {
      for (uoffset_t i = 0; i < vec->size(); i++) {
        if (!VerifyString(vec->Get(i))) return false;
      }
    }
    return true;
  }